

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O1

void __thiscall NodeList::add_node(NodeList *this,GridNode *node)

{
  int iVar1;
  int iVar2;
  GridNode **ppGVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  void *unaff_R15;
  
  iVar1 = this->count;
  lVar7 = (long)iVar1;
  this->count = iVar1 + 1;
  iVar2 = this->capacity;
  if (iVar2 == iVar1) {
    iVar5 = (int)((float)iVar2 * 1.5);
    if (iVar2 < 4) {
      iVar5 = iVar2 + 1;
    }
    this->capacity = iVar5;
    if (0 < iVar1) {
      unaff_R15 = operator_new__(lVar7 * 8);
      memcpy(unaff_R15,this->list,lVar7 * 8);
    }
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar5) {
      uVar6 = (long)iVar5 << 3;
    }
    ppGVar3 = (GridNode **)operator_new__(uVar6);
    this->list = ppGVar3;
    if (0 < iVar1) {
      lVar4 = 0;
      do {
        this->list[lVar4] = *(GridNode **)((long)unaff_R15 + lVar4 * 8);
        lVar4 = lVar4 + 1;
      } while (lVar7 != lVar4);
    }
  }
  this->list[lVar7] = node;
  return;
}

Assistant:

void add_node(GridNode *node)
    {
        count++;
        if (capacity == count - 1)
        {
            capacity = (capacity <= 3) ? (capacity + 1) : ((int)(capacity * 1.5f));
            GridNode **tempList;
            if (count > 1)
            {
                tempList = new GridNode *[count - 1];
                for (int i = 0; i < count - 1; i++)
                {
                    tempList[i] = list[i];
                }
            }
            list = new GridNode *[capacity];
            for (int i = 0; i < count - 1; i++)
            {
                list[i] = tempList[i];
            }
        }
        list[count - 1] = node;
    }